

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::
TestFactoryImpl<solitaire::cards::ShuffledDeckGeneratorTest_generatedDecksHaveDifferentOrder_Test>::
CreateTest(TestFactoryImpl<solitaire::cards::ShuffledDeckGeneratorTest_generatedDecksHaveDifferentOrder_Test>
           *this)

{
  Test *this_00;
  TestFactoryImpl<solitaire::cards::ShuffledDeckGeneratorTest_generatedDecksHaveDifferentOrder_Test>
  *this_local;
  
  this_00 = (Test *)operator_new(0x18);
  solitaire::cards::ShuffledDeckGeneratorTest_generatedDecksHaveDifferentOrder_Test::
  ShuffledDeckGeneratorTest_generatedDecksHaveDifferentOrder_Test
            ((ShuffledDeckGeneratorTest_generatedDecksHaveDifferentOrder_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }